

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Int32_To_UInt8(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                   int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  char *local_40;
  uchar *dest;
  PaInt32 *src;
  PaUtilTriangularDitherGenerator *ditherGenerator_local;
  uint count_local;
  int sourceStride_local;
  void *sourceBuffer_local;
  int destinationStride_local;
  void *destinationBuffer_local;
  
  local_40 = (char *)destinationBuffer;
  dest = (uchar *)sourceBuffer;
  ditherGenerator_local._0_4_ = count;
  while ((uint)ditherGenerator_local != 0) {
    *local_40 = (char)((uint)*(undefined4 *)dest >> 0x18) + -0x80;
    dest = dest + (long)sourceStride * 4;
    local_40 = local_40 + destinationStride;
    ditherGenerator_local._0_4_ = (uint)ditherGenerator_local - 1;
  }
  return;
}

Assistant:

static void Int32_To_UInt8(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    PaInt32 *src = (PaInt32*)sourceBuffer;
    unsigned char *dest =  (unsigned char*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
		(*dest) = (unsigned char)(((*src) >> 24) + 128); 

        src += sourceStride;
        dest += destinationStride;
    }
}